

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O3

vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
* __thiscall
TxOrphanage::GetChildrenFromDifferentPeer
          (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
           *__return_storage_ptr__,TxOrphanage *this,CTransactionRef *parent,NodeId nodeid)

{
  long lVar1;
  long lVar2;
  element_type *peVar3;
  const_iterator cVar4;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  ulong uVar9;
  long *plVar10;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
  *child_iter;
  const_iterator __cbeg;
  long in_FS_OFFSET;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  iters;
  long *local_88;
  long *plStack_80;
  long local_78;
  key_type local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (long *)0x0;
  plStack_80 = (long *)0x0;
  local_78 = 0;
  peVar3 = (parent->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
      ;
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_68.n = (uint32_t)uVar6;
      cVar4 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
              ::find(&(this->m_outpoint_to_orphan_it)._M_t,&local_68);
      if ((_Rb_tree_header *)cVar4._M_node !=
          &(this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header) {
        for (p_Var5 = *(_Rb_tree_node_base **)(cVar4._M_node + 3);
            p_Var5 != (_Rb_tree_node_base *)&cVar4._M_node[2]._M_left;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          if (*(long *)(*(long *)(p_Var5 + 1) + 0x50) != nodeid) {
            std::
            vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
            ::
            emplace_back<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const&>
                      ((vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
                        *)&local_88,
                       (_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                        *)(p_Var5 + 1));
          }
        }
      }
      plVar7 = plStack_80;
      plVar10 = local_88;
      peVar3 = (parent->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar6 = (ulong)((uint32_t)uVar6 + 1);
      uVar9 = ((long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    } while (uVar6 <= uVar9 && uVar9 - uVar6 != 0);
    if (local_88 != plStack_80) {
      uVar6 = (long)plStack_80 - (long)local_88 >> 3;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TxOrphanage::IteratorComparator>>
                (local_88,plStack_80,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxOrphanage::IteratorComparator>>
                (plVar10,plVar7);
    }
    if (local_88 != plStack_80) {
      plVar10 = local_88 + 1;
      do {
        plVar7 = plVar10;
        if (plVar7 == plStack_80) goto LAB_00ada423;
        plVar10 = plVar7 + 1;
      } while (plVar7[-1] != *plVar7);
      plVar8 = plVar7 + -1;
      lVar2 = plVar7[-1];
      for (; plVar10 != plStack_80; plVar10 = plVar10 + 1) {
        lVar1 = *plVar10;
        if (lVar2 != lVar1) {
          plVar8[1] = lVar1;
          plVar8 = plVar8 + 1;
        }
        lVar2 = lVar1;
      }
      if (plVar8 + 1 != plStack_80) {
        plStack_80 = plVar8 + 1;
      }
    }
  }
LAB_00ada423:
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::reserve(__return_storage_ptr__,(long)plStack_80 - (long)local_88 >> 3);
  plVar7 = plStack_80;
  for (plVar10 = local_88; plVar10 != plVar7; plVar10 = plVar10 + 1) {
    std::
    vector<std::pair<std::shared_ptr<CTransaction_const>,long>,std::allocator<std::pair<std::shared_ptr<CTransaction_const>,long>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>&,long&>
              ((vector<std::pair<std::shared_ptr<CTransaction_const>,long>,std::allocator<std::pair<std::shared_ptr<CTransaction_const>,long>>>
                *)__return_storage_ptr__,(shared_ptr<const_CTransaction> *)(*plVar10 + 0x40),
               (long *)(*plVar10 + 0x50));
  }
  if (local_88 != (long *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<CTransactionRef, NodeId>> TxOrphanage::GetChildrenFromDifferentPeer(const CTransactionRef& parent, NodeId nodeid) const
{
    // First construct vector of iterators to ensure we do not return duplicates of the same tx.
    std::vector<OrphanMap::iterator> iters;

    // For each output, get all entries spending this prevout, filtering for ones not from the specified peer.
    for (unsigned int i = 0; i < parent->vout.size(); i++) {
        const auto it_by_prev = m_outpoint_to_orphan_it.find(COutPoint(parent->GetHash(), i));
        if (it_by_prev != m_outpoint_to_orphan_it.end()) {
            for (const auto& elem : it_by_prev->second) {
                if (elem->second.fromPeer != nodeid) {
                    iters.emplace_back(elem);
                }
            }
        }
    }

    // Erase duplicates
    std::sort(iters.begin(), iters.end(), IteratorComparator());
    iters.erase(std::unique(iters.begin(), iters.end()), iters.end());

    // Convert iterators to pair<CTransactionRef, NodeId>
    std::vector<std::pair<CTransactionRef, NodeId>> children_found;
    children_found.reserve(iters.size());
    for (const auto& child_iter : iters) {
        children_found.emplace_back(child_iter->second.tx, child_iter->second.fromPeer);
    }
    return children_found;
}